

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply_sdf.cpp
# Opt level: O2

void sdf_tools::evaluateAtGridPoints(Sdf *sdf,Grid *grid)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iy;
  ulong uVar4;
  ulong uVar5;
  pointer pfVar6;
  pointer pfVar7;
  int ix;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  float extraout_XMM0_Da;
  int3 iVar11;
  real3 rVar12;
  real3 rVar13;
  float local_88;
  float local_58;
  
  iVar11 = Grid::getDimensions(grid);
  uVar1 = iVar11._0_8_;
  rVar12 = Grid::getSpacing(grid);
  rVar13 = Grid::getOffsets(grid);
  pfVar6 = (grid->field).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = iVar11.x;
  uVar10 = 0;
  if (0 < (int)uVar8) {
    uVar10 = (ulong)uVar8;
  }
  uVar2 = uVar1 >> 0x20;
  if (iVar11.y == 0 || (long)uVar1 < 0) {
    uVar2 = 0;
  }
  uVar4 = (ulong)(uint)iVar11.z;
  if (iVar11.z < 1) {
    uVar4 = 0;
  }
  for (uVar3 = 0; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    pfVar7 = pfVar6;
    for (uVar5 = 0; uVar5 != uVar2; uVar5 = uVar5 + 1) {
      for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
        local_88 = rVar12.x;
        local_58 = rVar13.x;
        (*sdf->_vptr_Sdf[2])
                  ((float)(int)uVar9 * local_88 + local_58,(float)(int)uVar3 * rVar12.z + rVar13.z,
                   sdf);
        pfVar7[uVar9] = extraout_XMM0_Da;
      }
      pfVar7 = pfVar7 + (int)uVar8;
    }
    pfVar6 = pfVar6 + ((long)uVar1 >> 0x20) * (long)(int)uVar8;
  }
  return;
}

Assistant:

void evaluateAtGridPoints(const sdf::Sdf *sdf, Grid *grid)
{
    auto applySdf = [sdf](real3 r, real& gridValue) {gridValue = sdf->at(r);};
    gridForEachPoint(applySdf, grid);
}